

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O3

void __thiscall MkvInterface::~MkvInterface(MkvInterface *this)

{
  EbmlStream *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer ppuVar3;
  pointer ppuVar4;
  int in_ESI;
  ulong uVar5;
  
  if (this->m_file != (StdIOCallback *)0x0) {
    close(this,in_ESI);
  }
  this_00 = this->aStream;
  if (this_00 != (EbmlStream *)0x0) {
    libebml::EbmlStream::~EbmlStream(this_00);
    operator_delete(this_00,8);
  }
  this->aStream = (EbmlStream *)0x0;
  ppuVar3 = (this->m_attachmentBuffer).
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppuVar4 = (this->m_attachmentBuffer).
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppuVar4 != ppuVar3) {
    uVar5 = 0;
    do {
      if (ppuVar3[uVar5] != (uchar *)0x0) {
        operator_delete__(ppuVar3[uVar5]);
        ppuVar3 = (this->m_attachmentBuffer).
                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppuVar4 = (this->m_attachmentBuffer).
                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppuVar4 - (long)ppuVar3 >> 3));
  }
  if (ppuVar4 != ppuVar3) {
    (this->m_attachmentBuffer).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppuVar3;
  }
  puVar1 = (this->m_keyPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_keyPositions).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->m_timeStamps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_timeStamps).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar2 = (this->m_attachmentSize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_attachmentSize).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->m_attachmentID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_attachmentID).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  ppuVar3 = (this->m_attachmentBuffer).
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppuVar3 != (pointer)0x0) {
    operator_delete(ppuVar3,(long)(this->m_attachmentBuffer).
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar3
                   );
  }
  ppuVar3 = (this->m_frameBuffer).
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppuVar3 != (pointer)0x0) {
    operator_delete(ppuVar3,(long)(this->m_frameBuffer).
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppuVar3
                   );
  }
  libebml::EbmlMaster::~EbmlMaster(&(this->m_fileSegment).super_EbmlMaster);
  return;
}

Assistant:

MkvInterface::~MkvInterface()
{
    if (m_file != NULL)
        close();
    
    if (aStream != NULL)
        delete aStream;
    aStream = NULL;
    
    for (size_t i=0; i<m_attachmentBuffer.size(); i++)
        delete[] m_attachmentBuffer.at(i);
    m_attachmentBuffer.clear();
}